

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O2

void ValueTypeGraphDemo(void)

{
  _List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>
  *e;
  pointer p_Var1;
  int i;
  long lVar2;
  vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> nodes;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> graph_val;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  all_edges;
  _Vector_base<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> local_88;
  Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> local_70;
  _Vector_base<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  local_30;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    local_70._0_8_ = lVar2;
    std::vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::
    emplace_back<xmotion::StateExample>
              ((vector<xmotion::StateExample,_std::allocator<xmotion::StateExample>_> *)&local_88,
               (StateExample *)&local_70);
  }
  local_70.vertex_map_._M_h._M_buckets = &local_70.vertex_map_._M_h._M_single_bucket;
  local_70.vertex_map_._M_h._M_bucket_count = 1;
  local_70.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.vertex_map_._M_h._M_element_count = 0;
  local_70.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)(local_88._M_impl.super__Vector_impl_data._M_start)->id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,1.0);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)(local_88._M_impl.super__Vector_impl_data._M_start)->id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[3].id,1.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,
          (StateExample)(local_88._M_impl.super__Vector_impl_data._M_start)->id,2.0);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[2].id,1.0);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[2].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,1.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[2].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,2.0);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[3].id,
          (StateExample)(local_88._M_impl.super__Vector_impl_data._M_start)->id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[3].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[1].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[3].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[2].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[8].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[7].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[4].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[7].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[8].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[8].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[5].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  AddEdge(&local_70,(StateExample)local_88._M_impl.super__Vector_impl_data._M_start[8].id,
          (StateExample)local_88._M_impl.super__Vector_impl_data._M_start[7].id,2.5);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  GetAllEdges((vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
               *)&local_30,&local_70);
  for (p_Var1 = local_30._M_impl.super__Vector_impl_data._M_start;
      p_Var1 != local_30._M_impl.super__Vector_impl_data._M_finish; p_Var1 = p_Var1 + 1) {
    xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
    Edge::PrintEdge((Edge *)(p_Var1->_M_node + 1));
  }
  std::
  _Vector_base<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Edge>_>_>
  ::~_Vector_base(&local_30);
  xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
  ~Graph(&local_70);
  std::_Vector_base<xmotion::StateExample,_std::allocator<xmotion::StateExample>_>::~_Vector_base
            (&local_88);
  return;
}

Assistant:

void ValueTypeGraphDemo() {
  std::vector<StateExample> nodes;

  // create nodes
  for (int i = 0; i < 9; i++) {
    nodes.push_back(StateExample(i));
  }

  // create a graph
  Graph<StateExample> graph_val;

  graph_val.AddEdge(nodes[0], nodes[1], 1.0);
  graph_val.AddEdge(nodes[0], nodes[3], 1.5);
  graph_val.AddEdge(nodes[1], nodes[0], 2.0);
  graph_val.AddEdge(nodes[1], nodes[4], 2.5);
  graph_val.AddEdge(nodes[1], nodes[2], 1.0);
  graph_val.AddEdge(nodes[2], nodes[1], 1.5);
  graph_val.AddEdge(nodes[2], nodes[5], 2.0);
  graph_val.AddEdge(nodes[3], nodes[0], 2.5);
  graph_val.AddEdge(nodes[3], nodes[4], 2.5);
  graph_val.AddEdge(nodes[4], nodes[1], 2.5);
  graph_val.AddEdge(nodes[4], nodes[3], 2.5);
  graph_val.AddEdge(nodes[4], nodes[5], 2.5);
  graph_val.AddEdge(nodes[5], nodes[2], 2.5);
  graph_val.AddEdge(nodes[5], nodes[4], 2.5);
  graph_val.AddEdge(nodes[5], nodes[8], 2.5);
  graph_val.AddEdge(nodes[7], nodes[4], 2.5);
  graph_val.AddEdge(nodes[7], nodes[8], 2.5);
  graph_val.AddEdge(nodes[8], nodes[5], 2.5);
  graph_val.AddEdge(nodes[8], nodes[7], 2.5);

  auto all_edges = graph_val.GetAllEdges();
  for (auto &e : all_edges) e->PrintEdge();

  // no need to deallocate memory, all data structures are copied to graph
}